

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

string * format_error<char_const*&,unsigned_long&>
                   (string *__return_storage_ptr__,Options *opt,char *type,TokenInfo *context,
                   char *msg,char **args,unsigned_long *args_1)

{
  TokenInfo *type_00;
  char *pcVar1;
  char *filename;
  optional<const_TokenStream::TextStream_&> local_98;
  tuple<unsigned_long&,unsigned_long&> local_90 [16];
  pair<unsigned_long,_unsigned_long> local_80;
  long local_70;
  size_t length;
  size_t colno;
  size_t lineno;
  optional<const_TokenStream::TextStream_&> local_50;
  char **local_48;
  char **args_local;
  char *msg_local;
  TokenInfo *context_local;
  char *type_local;
  Options *opt_local;
  
  local_48 = args;
  args_local = (char **)msg;
  msg_local = (char *)context;
  context_local = (TokenInfo *)type;
  type_local = &opt->help;
  opt_local = (Options *)__return_storage_ptr__;
  if (context->begin == context->end) {
    std::experimental::optional<const_TokenStream::TextStream_&>::optional(&local_50);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    format_error<char_const*&,unsigned_long&>
              (__return_storage_ptr__,opt,type,&local_50,pcVar1,0,0,0,(char *)args_local,local_48,
               args_1);
  }
  else {
    local_70 = context->end - context->begin;
    local_80 = TokenStream::TextStream::linecol_from_offset(context->stream,context->begin);
    std::tie<unsigned_long,unsigned_long>((unsigned_long *)local_90,&colno);
    std::tuple<unsigned_long&,unsigned_long&>::operator=(local_90,&local_80);
    pcVar1 = type_local;
    type_00 = context_local;
    std::experimental::optional<const_TokenStream::TextStream_&>::optional
              (&local_98,*(TextStream **)msg_local);
    filename = (char *)std::__cxx11::string::c_str();
    format_error<char_const*&,unsigned_long&>
              (__return_storage_ptr__,(Options *)pcVar1,(char *)type_00,&local_98,filename,
               (uint32_t)colno,(uint32_t)length,(uint32_t)local_70,(char *)args_local,local_48,
               args_1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const TokenStream::TokenInfo& context, const char* msg, Args&&... args)
{
    if(context.begin == context.end)
    {
        return format_error(opt, type, nullopt, context.stream.stream_name.c_str(), 0, 0, 0,
                            msg, std::forward<Args>(args)...);
    }
    else
    {
        size_t lineno, colno;
        size_t length = context.end - context.begin;
        std::tie(lineno, colno) = context.stream.linecol_from_offset(context.begin);
        return format_error(opt, type, context.stream, context.stream.stream_name.c_str(), lineno, colno, length,
                            msg, std::forward<Args>(args)...);
    }
}